

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short)>
::Invoke(FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short)>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
        vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        *args_1,unsigned_short args_2)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  local_48;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  holder;
  ArgumentTuple tuple;
  unsigned_short args_local_2;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short)>
  *this_local;
  
  tuple.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl._6_2_ = args_2;
  std::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short>
  ::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short,_true,_true>
            ((tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short>
              *)&holder,args,args_1,
             (unsigned_short *)
             ((long)&tuple.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_unsigned_short>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                     ._M_head_impl + 6));
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<void>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
              *)&local_48,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
            ::operator->(&local_48);
  ActionResultHolder<void>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ::~unique_ptr(&local_48);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }